

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O2

void Kit_PlaToIsop(char *pSop,Vec_Int_t *vCover)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  int *__ptr;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar2 = Kit_PlaGetVarNum(pSop);
  if ((int)uVar2 < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,0x11f,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
  }
  vCover->nSize = 0;
  do {
    if (*pSop == '\0') {
      return;
    }
    iVar6 = 0;
    for (uVar3 = (ulong)uVar2; 0 < (long)uVar3; uVar3 = uVar3 - 1) {
      cVar1 = pSop[uVar3 - 1];
      if (cVar1 == '-') {
        iVar6 = iVar6 << 2;
      }
      else if (cVar1 == '1') {
        iVar6 = iVar6 * 4 + 2;
      }
      else {
        if (cVar1 != '0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                        ,0x12d,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
        }
        iVar6 = iVar6 * 4 + 1;
      }
    }
    iVar4 = vCover->nSize;
    if (iVar4 == vCover->nCap) {
      uVar5 = iVar4 * 2;
      if (iVar4 < 0x10) {
        uVar5 = 0x10;
      }
      __ptr = vCover->pArray;
      if (iVar4 < (int)uVar5) {
        if (__ptr == (int *)0x0) {
          __ptr = (int *)malloc((ulong)uVar5 << 2);
        }
        else {
          __ptr = (int *)realloc(__ptr,(ulong)uVar5 << 2);
        }
        vCover->pArray = __ptr;
        if (__ptr == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vCover->nCap = uVar5;
        iVar4 = vCover->nSize;
      }
    }
    else {
      __ptr = vCover->pArray;
    }
    vCover->nSize = iVar4 + 1;
    __ptr[iVar4] = iVar6;
    pSop = pSop + (uVar2 + 3);
  } while( true );
}

Assistant:

void Kit_PlaToIsop( char * pSop, Vec_Int_t * vCover )
{
    char * pCube;
    int k, nVars, Entry;
    nVars = Kit_PlaGetVarNum( pSop );
    assert( nVars > 0 );
    // create cubes
    Vec_IntClear( vCover );
    for ( pCube = pSop; *pCube; pCube += nVars + 3 )
    {
        Entry = 0;
        for ( k = nVars - 1; k >= 0; k-- )
            if ( pCube[k] == '0' )
                Entry = (Entry << 2) | 1;
            else if ( pCube[k] == '1' )
                Entry = (Entry << 2) | 2;
            else if ( pCube[k] == '-' )
                Entry = (Entry << 2);
            else 
                assert( 0 );
        Vec_IntPush( vCover, Entry );
    }
}